

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O3

char * ulocimp_toBcpType_63(char *key,char *type,UBool *isKnownKey,UBool *isSpecialType)

{
  UBool UVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  char *pcVar5;
  uint uVar6;
  
  if (isKnownKey != (UBool *)0x0) {
    *isKnownKey = '\0';
  }
  if (isSpecialType != (UBool *)0x0) {
    *isSpecialType = '\0';
  }
  iVar2 = init((EVP_PKEY_CTX *)key);
  if ((char)iVar2 == '\0') {
    return (char *)0x0;
  }
  pvVar3 = uhash_get_63(gLocExtKeyMap,key);
  if (pvVar3 == (void *)0x0) {
    return (char *)0x0;
  }
  if (isKnownKey != (UBool *)0x0) {
    *isKnownKey = '\x01';
  }
  pvVar4 = uhash_get_63(*(UHashtable **)((long)pvVar3 + 0x10),type);
  if (pvVar4 != (void *)0x0) {
    return *(char **)((long)pvVar4 + 8);
  }
  uVar6 = *(uint *)((long)pvVar3 + 0x18);
  if (uVar6 == 0) {
    return (char *)0x0;
  }
  if (((uVar6 & 1) == 0) || (UVar1 = isSpecialTypeCodepoints(type), UVar1 == '\0')) {
    if ((uVar6 & 2) != 0) {
      UVar1 = isSpecialTypeReorderCode(type);
      if (UVar1 != '\0') goto LAB_002d554a;
      uVar6 = *(uint *)((long)pvVar3 + 0x18);
    }
    if ((uVar6 & 4) == 0) {
      return (char *)0x0;
    }
    UVar1 = isSpecialTypeRgKeyValue(type);
    pcVar5 = (char *)0x0;
    if (UVar1 != '\0') {
      pcVar5 = type;
    }
    if (UVar1 == '\0' || isSpecialType == (UBool *)0x0) {
      return pcVar5;
    }
  }
  else {
LAB_002d554a:
    if (isSpecialType == (UBool *)0x0) {
      return type;
    }
  }
  *isSpecialType = '\x01';
  return type;
}

Assistant:

U_CFUNC const char*
ulocimp_toBcpType(const char* key, const char* type, UBool* isKnownKey, UBool* isSpecialType) {
    if (isKnownKey != NULL) {
        *isKnownKey = FALSE;
    }
    if (isSpecialType != NULL) {
        *isSpecialType = FALSE;
    }

    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        if (isKnownKey != NULL) {
            *isKnownKey = TRUE;
        }
        LocExtType* t = (LocExtType*)uhash_get(keyData->typeMap, type);
        if (t != NULL) {
            return t->bcpId;
        }
        if (keyData->specialTypes != SPECIALTYPE_NONE) {
            UBool matched = FALSE;
            if (keyData->specialTypes & SPECIALTYPE_CODEPOINTS) {
                matched = isSpecialTypeCodepoints(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_REORDER_CODE) {
                matched = isSpecialTypeReorderCode(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_RG_KEY_VALUE) {
                matched = isSpecialTypeRgKeyValue(type);
            }
            if (matched) {
                if (isSpecialType != NULL) {
                    *isSpecialType = TRUE;
                }
                return type;
            }
        }
    }
    return NULL;
}